

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.c
# Opt level: O0

void adios2sysMD5_DigestToHex(uchar *digest,char *buffer)

{
  char *pcVar1;
  int i;
  char *out;
  char *buffer_local;
  uchar *digest_local;
  
  out = buffer;
  for (i = 0; i < 0x10; i = i + 1) {
    pcVar1 = out + 1;
    *out = "0123456789abcdef"[(int)(uint)digest[i] >> 4];
    out = out + 2;
    *pcVar1 = "0123456789abcdef"[(int)(digest[i] & 0xf)];
  }
  return;
}

Assistant:

void kwsysMD5_DigestToHex(unsigned char const digest[16], char buffer[32])
{
  /* Map from 4-bit index to hexadecimal representation.  */
  static char const hex[16] = { '0', '1', '2', '3', '4', '5', '6', '7',
                                '8', '9', 'a', 'b', 'c', 'd', 'e', 'f' };

  /* Map each 4-bit block separately.  */
  char* out = buffer;
  int i;
  for (i = 0; i < 16; ++i) {
    *out++ = hex[digest[i] >> 4];
    *out++ = hex[digest[i] & 0xF];
  }
}